

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

Vec_Ptr_t * Ptr_AbcDeriveNode(Abc_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *p;
  char *pcVar2;
  Abc_Obj_t *pObj_00;
  Vec_Ptr_t *vNode;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjFaninNum(pObj);
  p = Vec_PtrAllocExact((iVar1 + 1) * 2 + 2);
  iVar1 = Abc_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x72,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
  }
  iVar1 = Abc_NtkHasAig(pObj->pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkHasSop(pObj->pNtk);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x77,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
    }
    pcVar2 = Ptr_SopToTypeName((char *)(pObj->field_5).pData);
    Vec_PtrPush(p,pcVar2);
  }
  else {
    pcVar2 = Ptr_HopToType(pObj);
    Vec_PtrPush(p,pcVar2);
  }
  pcVar2 = Ptr_AbcObjName(pObj);
  Vec_PtrPush(p,pcVar2);
  iVar1 = Abc_ObjFaninNum(pObj);
  if (2 < iVar1) {
    __assert_fail("Abc_ObjFaninNum(pObj) <= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x79,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
  }
  for (vNode._4_4_ = 0; iVar1 = Abc_ObjFaninNum(pObj), vNode._4_4_ < iVar1;
      vNode._4_4_ = vNode._4_4_ + 1) {
    pObj_00 = Abc_ObjFanin(pObj,vNode._4_4_);
    pcVar2 = "l";
    if (vNode._4_4_ != 0) {
      pcVar2 = "r";
    }
    Vec_PtrPush(p,pcVar2);
    pcVar2 = Ptr_AbcObjName(pObj_00);
    Vec_PtrPush(p,pcVar2);
  }
  Vec_PtrPush(p,"o");
  pcVar2 = Ptr_AbcObjName(pObj);
  Vec_PtrPush(p,pcVar2);
  iVar1 = Ptr_CheckArray(p);
  if (iVar1 == 0) {
    __assert_fail("Ptr_CheckArray(vNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x81,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
  }
  return p;
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveNode( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin; int i;
    Vec_Ptr_t * vNode = Vec_PtrAllocExact( 2 + 2 * (1 + Abc_ObjFaninNum(pObj)) );
    assert( Abc_ObjIsNode(pObj) );
    if ( Abc_NtkHasAig(pObj->pNtk) )
        Vec_PtrPush( vNode, Ptr_HopToType(pObj) );
    else if ( Abc_NtkHasSop(pObj->pNtk) )
        Vec_PtrPush( vNode, Ptr_SopToTypeName((char *)pObj->pData) );
    else assert( 0 );
    Vec_PtrPush( vNode, Ptr_AbcObjName(pObj) );
    assert( Abc_ObjFaninNum(pObj) <= 2 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        Vec_PtrPush( vNode, (void*)(i ? "r" : "l") );
        Vec_PtrPush( vNode, Ptr_AbcObjName(pFanin) );
    }
    Vec_PtrPush( vNode, (void*)("o") );
    Vec_PtrPush( vNode, Ptr_AbcObjName(pObj) );
    assert( Ptr_CheckArray(vNode) );
    return vNode;
}